

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O1

void __thiscall
OptionParser::parseTimeOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  size_type *psVar1;
  char *__s;
  long lVar2;
  _Alloc_hider _Var3;
  int iVar4;
  TimeOption option;
  int iVar5;
  long *plVar6;
  char **ppcVar7;
  InputError *pIVar8;
  size_type *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  size_type *local_100;
  string value;
  string s2;
  size_type *local_b8;
  string s1;
  string keyword;
  string timeUnits;
  undefined1 local_50 [8];
  string timeStr;
  
  timeUnits.field_2._8_8_ =
       (tokenList->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(tokenList->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - timeUnits.field_2._8_8_)
               >> 5);
  if (iVar5 < 2) {
    return;
  }
  local_b8 = &s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  value.field_2._8_8_ = &s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length._0_1_ = 0;
  s1.field_2._8_8_ = &keyword._M_string_length;
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  local_100 = &value._M_string_length;
  value._M_dataplus._M_p = (pointer)0x0;
  value._M_string_length._0_1_ = 0;
  Utilities::upperCase((string *)local_50,(string *)timeUnits.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)local_50);
  psVar1 = &timeStr._M_string_length;
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_b8);
  s2.field_2._8_8_ = network;
  if (iVar4 == 0) {
    ppcVar7 = timeOptionKeywords + 8;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_b8);
    if (iVar4 != 0) {
      Utilities::upperCase((string *)local_50,(string *)(timeUnits.field_2._8_8_ + 0x20));
      std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),(string *)local_50)
      ;
      if (local_50 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_50);
      }
      keyword.field_2._8_8_ = &timeUnits._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&keyword.field_2 + 8),local_b8,
                 s1._M_dataplus._M_p + (long)local_b8);
      std::__cxx11::string::append(keyword.field_2._M_local_buf + 8);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 (keyword.field_2._M_local_buf + 8,value.field_2._8_8_);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar9) {
        timeStr._M_string_length = *psVar9;
        timeStr.field_2._M_allocated_capacity = plVar6[3];
        local_50 = (undefined1  [8])psVar1;
      }
      else {
        timeStr._M_string_length = *psVar9;
        local_50 = (undefined1  [8])*plVar6;
      }
      timeStr._M_dataplus._M_p = (pointer)plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)(s1.field_2._M_local_buf + 8),(string *)local_50);
      if (local_50 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_50);
      }
      if ((size_type *)keyword.field_2._8_8_ != &timeUnits._M_string_length) {
        operator_delete((void *)keyword.field_2._8_8_);
      }
      iVar4 = 2;
      goto LAB_00136e7f;
    }
    ppcVar7 = timeOptionKeywords + 9;
  }
  _Var3._M_p = keyword._M_dataplus._M_p;
  __s = *ppcVar7;
  strlen(__s);
  iVar4 = 1;
  std::__cxx11::string::_M_replace((ulong)((long)&s1.field_2 + 8),0,_Var3._M_p,(ulong)__s);
LAB_00136e7f:
  if (iVar4 < iVar5) {
    option = Utilities::findFullMatch((string *)((long)&s1.field_2 + 8),timeOptionKeywords);
    if ((int)option < 0) {
      pIVar8 = (InputError *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,s1.field_2._8_8_,keyword._M_dataplus._M_p + s1.field_2._8_8_);
      InputError::InputError(pIVar8,3,&local_120);
      __cxa_throw(pIVar8,&InputError::typeinfo,ENerror::~ENerror);
    }
    if (option != REPORT_STATISTIC) {
      local_50 = (undefined1  [8])&timeStr._M_string_length;
      lVar2 = *(long *)(timeUnits.field_2._8_8_ + (ulong)(uint)(iVar4 << 5));
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar2,
                 *(long *)(timeUnits.field_2._8_8_ + 8 + (ulong)(uint)(iVar4 << 5)) + lVar2);
      keyword.field_2._8_8_ = &timeUnits._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)((long)&keyword.field_2 + 8),"");
      if (iVar4 + 1 < iVar5) {
        std::__cxx11::string::_M_assign((string *)(keyword.field_2._M_local_buf + 8));
      }
      iVar5 = Utilities::getSeconds((string *)local_50,(string *)((long)&keyword.field_2 + 8));
      if (iVar5 < 0) {
        pIVar8 = (InputError *)__cxa_allocate_exception(0x30);
        std::operator+(&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ," ");
        std::operator+(&local_160,&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&keyword.field_2 + 8));
        InputError::InputError(pIVar8,7,&local_160);
        __cxa_throw(pIVar8,&InputError::typeinfo,ENerror::~ENerror);
      }
      Options::setOption((Options *)(s2.field_2._8_8_ + 0x228),option,iVar5);
      if ((size_type *)keyword.field_2._8_8_ != &timeUnits._M_string_length) {
        operator_delete((void *)keyword.field_2._8_8_);
      }
      if (local_50 != (undefined1  [8])&timeStr._M_string_length) {
        operator_delete((void *)local_50);
      }
    }
  }
  if (local_100 != &value._M_string_length) {
    operator_delete(local_100);
  }
  if ((size_type *)s1.field_2._8_8_ != &keyword._M_string_length) {
    operator_delete((void *)s1.field_2._8_8_);
  }
  if ((size_type *)value.field_2._8_8_ != &s2._M_string_length) {
    operator_delete((void *)value.field_2._8_8_);
  }
  if (local_b8 != &s1._M_string_length) {
    operator_delete(local_b8);
  }
  return;
}

Assistant:

void OptionParser::parseTimeOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    int nTokens = (int)tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords

    string s1, s2, keyword, value;
    s1 = Utilities::upperCase(tokens[0]);
    int i = 1;

    // ... check for single keyword option (for EPANET 2 compatibility)

    if (s1 == w_DURATION) keyword = timeOptionKeywords[Options::TOTAL_DURATION];
    else if (s1 == w_STATISTIC) keyword = timeOptionKeywords[Options::REPORT_STATISTIC];

    // ... otherwise form option keyword

    else
    {
        s2 = Utilities::upperCase(tokens[1]);
        keyword = s1 + "_" + s2;
        i = 2;
    }
    if ( i >= nTokens ) return;


    // ... find which time option we have

    int option = Utilities::findFullMatch(keyword, timeOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);

    // ... skip STATISTIC option

    if (option == Options::REPORT_STATISTIC) return;

    // ... create strings to hold a time value and its units

    string timeStr = tokens[i];
    string timeUnits = "";
    if ( nTokens > ++i ) timeUnits = tokens[i];

    // ... convert time value string to seconds

    int seconds = Utilities::getSeconds(timeStr, timeUnits);
    if (seconds < 0)
    {
        throw InputError(InputError::INVALID_TIME, timeStr + " " + timeUnits);
    }
    network->options.setOption((Options::TimeOption)option, seconds);
}